

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
D5xNvmFlash::getLockRegions
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,D5xNvmFlash *this)

{
  byte bVar1;
  ulong *puVar2;
  ulong uVar3;
  uint32_t addr;
  uint32_t region;
  ulong __n;
  reference rVar4;
  allocator_type local_31;
  
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(ulong)(this->super_Flash)._lockRegions,&local_31);
  addr = 0x804008;
  bVar1 = 0;
  for (__n = 0; __n < (this->super_Flash)._lockRegions; __n = __n + 1) {
    if ((__n & 7) == 0) {
      bVar1 = Samba::readByte((this->super_Flash)._samba,addr);
      addr = addr + 1;
    }
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](__return_storage_ptr__,__n);
    puVar2 = rVar4._M_p;
    if ((bVar1 >> ((uint)__n & 7) & 1) == 0) {
      uVar3 = rVar4._M_mask | *puVar2;
    }
    else {
      uVar3 = ~rVar4._M_mask & *puVar2;
    }
    *puVar2 = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool>
D5xNvmFlash::getLockRegions()
{
    uint8_t lockBits = 0;
    uint32_t addr = NVM_UP_ADDR + NVM_UP_NVM_LOCK_OFFSET;
    std::vector<bool> regions(_lockRegions);

    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (region % 8 == 0)
            lockBits = _samba.readByte(addr++);
        regions[region] = (lockBits & (1 << (region % 8))) == 0;
    }

    return regions;
}